

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_mul(secp256k1_fe *r,secp256k1_fe *a,secp256k1_fe *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  ulong uVar67;
  char *pcVar68;
  ulong uVar69;
  ulong uVar70;
  char *pcVar71;
  undefined8 uStack_c0;
  
  secp256k1_fe_verify(a);
  secp256k1_fe_verify(b);
  secp256k1_fe_verify_magnitude(a,8);
  secp256k1_fe_verify_magnitude(b,8);
  if (r == b) {
    pcVar68 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_impl.h"
    ;
    pcVar71 = "test condition failed: r != b";
    uStack_c0 = 0x15a;
  }
  else if (a == b) {
    pcVar68 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_impl.h"
    ;
    pcVar71 = "test condition failed: a != b";
    uStack_c0 = 0x15b;
  }
  else {
    uVar69 = a->n[0];
    if (uVar69 >> 0x38 == 0) {
      uVar1 = a->n[1];
      if (uVar1 < 0x100000000000000) {
        uVar2 = a->n[2];
        if (uVar2 < 0x100000000000000) {
          uVar3 = a->n[3];
          if (uVar3 < 0x100000000000000) {
            uVar4 = a->n[4];
            if (uVar4 >> 0x34 == 0) {
              uVar67 = b->n[0];
              if (uVar67 < 0x100000000000000) {
                uVar70 = b->n[1];
                if (uVar70 < 0x100000000000000) {
                  uVar5 = b->n[2];
                  if (uVar5 < 0x100000000000000) {
                    uVar6 = b->n[3];
                    if (uVar6 < 0x100000000000000) {
                      uVar7 = b->n[4];
                      if (uVar7 < 0x10000000000000) {
                        auVar8._8_8_ = 0;
                        auVar8._0_8_ = uVar6;
                        auVar39._8_8_ = 0;
                        auVar39._0_8_ = uVar69;
                        auVar9._8_8_ = 0;
                        auVar9._0_8_ = uVar5;
                        auVar40._8_8_ = 0;
                        auVar40._0_8_ = uVar1;
                        auVar10._8_8_ = 0;
                        auVar10._0_8_ = uVar70;
                        auVar41._8_8_ = 0;
                        auVar41._0_8_ = uVar2;
                        auVar11._8_8_ = 0;
                        auVar11._0_8_ = uVar67;
                        auVar42._8_8_ = 0;
                        auVar42._0_8_ = uVar3;
                        auVar12._8_8_ = 0;
                        auVar12._0_8_ = uVar7;
                        auVar43._8_8_ = 0;
                        auVar43._0_8_ = uVar4;
                        auVar13._8_8_ = 0;
                        auVar13._0_8_ = SUB168(auVar12 * auVar43,0);
                        auVar8 = auVar13 * ZEXT816(0x1000003d10) +
                                 auVar8 * auVar39 +
                                 auVar9 * auVar40 + auVar11 * auVar42 + auVar10 * auVar41;
                        auVar14._8_8_ = 0;
                        auVar14._0_8_ = uVar7;
                        auVar44._8_8_ = 0;
                        auVar44._0_8_ = uVar69;
                        auVar15._8_8_ = 0;
                        auVar15._0_8_ = uVar6;
                        auVar45._8_8_ = 0;
                        auVar45._0_8_ = uVar1;
                        auVar16._8_8_ = 0;
                        auVar16._0_8_ = uVar5;
                        auVar46._8_8_ = 0;
                        auVar46._0_8_ = uVar2;
                        auVar17._8_8_ = 0;
                        auVar17._0_8_ = uVar70;
                        auVar47._8_8_ = 0;
                        auVar47._0_8_ = uVar3;
                        auVar18._8_8_ = 0;
                        auVar18._0_8_ = uVar67;
                        auVar48._8_8_ = 0;
                        auVar48._0_8_ = uVar4;
                        auVar19._8_8_ = 0;
                        auVar19._0_8_ = SUB168(auVar12 * auVar43,8);
                        auVar9 = auVar19 * ZEXT816(0x1000003d10000) +
                                 auVar14 * auVar44 +
                                 auVar15 * auVar45 +
                                 auVar16 * auVar46 + auVar18 * auVar48 + auVar17 * auVar47 +
                                 (auVar8 >> 0x34);
                        auVar20._8_8_ = 0;
                        auVar20._0_8_ = uVar67;
                        auVar49._8_8_ = 0;
                        auVar49._0_8_ = uVar69;
                        auVar21._8_8_ = 0;
                        auVar21._0_8_ = uVar7;
                        auVar50._8_8_ = 0;
                        auVar50._0_8_ = uVar1;
                        auVar22._8_8_ = 0;
                        auVar22._0_8_ = uVar6;
                        auVar51._8_8_ = 0;
                        auVar51._0_8_ = uVar2;
                        auVar23._8_8_ = 0;
                        auVar23._0_8_ = uVar5;
                        auVar52._8_8_ = 0;
                        auVar52._0_8_ = uVar3;
                        auVar24._8_8_ = 0;
                        auVar24._0_8_ = uVar70;
                        auVar53._8_8_ = 0;
                        auVar53._0_8_ = uVar4;
                        auVar11 = (auVar9 >> 0x34) +
                                  auVar21 * auVar50 +
                                  auVar22 * auVar51 + auVar24 * auVar53 + auVar23 * auVar52;
                        auVar25._8_8_ = 0;
                        auVar25._0_8_ =
                             auVar11._0_8_ * 0x10 & 0xfffffffffffff0U | (ulong)(auVar9._6_2_ & 0xf);
                        auVar10 = auVar25 * ZEXT816(0x1000003d1) + auVar20 * auVar49;
                        uVar67 = auVar10._0_8_;
                        uVar70 = auVar10._8_8_;
                        r->n[0] = uVar67 & 0xfffffffffffff;
                        auVar64._8_8_ = uVar70 >> 0x34;
                        auVar64._0_8_ = uVar70 * 0x1000 | uVar67 >> 0x34;
                        auVar26._8_8_ = 0;
                        auVar26._0_8_ = uVar69;
                        auVar54._8_8_ = 0;
                        auVar54._0_8_ = b->n[1];
                        auVar27._8_8_ = 0;
                        auVar27._0_8_ = uVar1;
                        auVar55._8_8_ = 0;
                        auVar55._0_8_ = b->n[0];
                        auVar10 = auVar26 * auVar54 + auVar64 + auVar27 * auVar55;
                        if (auVar10._8_8_ >> 0x32 == 0) {
                          auVar28._8_8_ = 0;
                          auVar28._0_8_ = uVar2;
                          auVar56._8_8_ = 0;
                          auVar56._0_8_ = b->n[4];
                          auVar29._8_8_ = 0;
                          auVar29._0_8_ = uVar3;
                          auVar57._8_8_ = 0;
                          auVar57._0_8_ = b->n[3];
                          auVar30._8_8_ = 0;
                          auVar30._0_8_ = uVar4;
                          auVar58._8_8_ = 0;
                          auVar58._0_8_ = b->n[2];
                          auVar11 = auVar30 * auVar58 +
                                    auVar28 * auVar56 + (auVar11 >> 0x34) + auVar29 * auVar57;
                          if (auVar11._8_8_ < 0x4000000000000) {
                            auVar31._8_8_ = 0;
                            auVar31._0_8_ = auVar11._0_8_ & 0xfffffffffffff;
                            auVar10 = auVar10 + auVar31 * ZEXT816(0x1000003d10);
                            r->n[1] = auVar10._0_8_ & 0xfffffffffffff;
                            auVar32._8_8_ = 0;
                            auVar32._0_8_ = uVar69;
                            auVar59._8_8_ = 0;
                            auVar59._0_8_ = b->n[2];
                            auVar33._8_8_ = 0;
                            auVar33._0_8_ = uVar1;
                            auVar60._8_8_ = 0;
                            auVar60._0_8_ = b->n[1];
                            auVar34._8_8_ = 0;
                            auVar34._0_8_ = uVar2;
                            auVar61._8_8_ = 0;
                            auVar61._0_8_ = b->n[0];
                            auVar10 = auVar32 * auVar59 + (auVar10 >> 0x34) + auVar33 * auVar60 +
                                      auVar34 * auVar61;
                            if (auVar10._8_8_ < 0x4000000000000) {
                              auVar35._8_8_ = 0;
                              auVar35._0_8_ = uVar3;
                              auVar62._8_8_ = 0;
                              auVar62._0_8_ = b->n[4];
                              auVar36._8_8_ = 0;
                              auVar36._0_8_ = uVar4;
                              auVar63._8_8_ = 0;
                              auVar63._0_8_ = b->n[3];
                              auVar11 = auVar35 * auVar62 + (auVar11 >> 0x34) + auVar36 * auVar63;
                              uVar69 = auVar11._8_8_;
                              if (uVar69 < 0x4000000000000) {
                                auVar37._8_8_ = 0;
                                auVar37._0_8_ = auVar11._0_8_;
                                auVar10 = auVar10 + auVar37 * ZEXT816(0x1000003d10);
                                auVar11 = auVar10 >> 0x34;
                                auVar66._8_8_ = 0;
                                auVar66._0_8_ = auVar11._0_8_;
                                auVar38._8_8_ = 0;
                                auVar38._0_8_ = uVar69;
                                auVar65._8_8_ = auVar11._8_8_;
                                auVar65._0_8_ = auVar8._0_8_ & 0xfffffffffffff;
                                r->n[2] = auVar10._0_8_ & 0xfffffffffffff;
                                auVar66 = auVar38 * ZEXT816(0x1000003d10000) + auVar65 + auVar66;
                                uVar69 = auVar66._0_8_;
                                r->n[3] = uVar69 & 0xfffffffffffff;
                                r->n[4] = (auVar66._8_8_ << 0xc | uVar69 >> 0x34) +
                                          (auVar9._0_8_ & 0xffffffffffff);
                                r->magnitude = 1;
                                r->normalized = 0;
                                secp256k1_fe_verify(r);
                                return;
                              }
                              pcVar68 = 
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
                              ;
                              pcVar71 = 
                              "test condition failed: secp256k1_u128_check_bits((&d), (114))";
                              uStack_c0 = 0x82;
                              goto LAB_00129feb;
                            }
                            pcVar71 = 
                            "test condition failed: secp256k1_u128_check_bits((&c), (114))";
                            uStack_c0 = 0x7e;
                          }
                          else {
                            pcVar71 = 
                            "test condition failed: secp256k1_u128_check_bits((&d), (114))";
                            uStack_c0 = 0x70;
                          }
                        }
                        else {
                          pcVar71 = "test condition failed: secp256k1_u128_check_bits((&c), (114))";
                          uStack_c0 = 0x6b;
                        }
                      }
                      else {
                        pcVar71 = "test condition failed: ((b[4]) >> (52)) == 0";
                        uStack_c0 = 0x21;
                      }
                    }
                    else {
                      pcVar71 = "test condition failed: ((b[3]) >> (56)) == 0";
                      uStack_c0 = 0x20;
                    }
                  }
                  else {
                    pcVar71 = "test condition failed: ((b[2]) >> (56)) == 0";
                    uStack_c0 = 0x1f;
                  }
                }
                else {
                  pcVar71 = "test condition failed: ((b[1]) >> (56)) == 0";
                  uStack_c0 = 0x1e;
                }
              }
              else {
                pcVar71 = "test condition failed: ((b[0]) >> (56)) == 0";
                uStack_c0 = 0x1d;
              }
            }
            else {
              pcVar71 = "test condition failed: ((a[4]) >> (52)) == 0";
              uStack_c0 = 0x1c;
            }
          }
          else {
            pcVar71 = "test condition failed: ((a[3]) >> (56)) == 0";
            uStack_c0 = 0x1b;
          }
        }
        else {
          pcVar71 = "test condition failed: ((a[2]) >> (56)) == 0";
          uStack_c0 = 0x1a;
        }
      }
      else {
        pcVar71 = "test condition failed: ((a[1]) >> (56)) == 0";
        uStack_c0 = 0x19;
      }
    }
    else {
      pcVar71 = "test condition failed: ((a[0]) >> (56)) == 0";
      uStack_c0 = 0x18;
    }
    pcVar68 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
    ;
  }
LAB_00129feb:
  fprintf(_stderr,"%s:%d: %s\n",pcVar68,uStack_c0,pcVar71);
  abort();
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_mul(secp256k1_fe *r, const secp256k1_fe *a, const secp256k1_fe * SECP256K1_RESTRICT b) {
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY(b);
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 8);
    SECP256K1_FE_VERIFY_MAGNITUDE(b, 8);
    VERIFY_CHECK(r != b);
    VERIFY_CHECK(a != b);

    secp256k1_fe_impl_mul(r, a, b);
    r->magnitude = 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}